

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::DefineGroupNode::AccumDefineGroups
          (DefineGroupNode *this,ScriptContext *scriptContext,int *minGroup,int *maxGroup)

{
  ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0x6000,scriptContext,(PVOID)0x0);
  if (this->groupId < *minGroup) {
    *minGroup = this->groupId;
  }
  if (*maxGroup < this->groupId) {
    *maxGroup = this->groupId;
  }
  (*this->body->_vptr_Node[0x10])(this->body,scriptContext,minGroup,maxGroup);
  return;
}

Assistant:

void DefineGroupNode::AccumDefineGroups(Js::ScriptContext* scriptContext, int& minGroup, int& maxGroup)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);

        if (groupId < minGroup)
            minGroup = groupId;
        if (groupId > maxGroup)
            maxGroup = groupId;
        body->AccumDefineGroups(scriptContext, minGroup, maxGroup);
    }